

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O0

void __thiscall
helics::apps::AsioBrokerServer::startServer
          (AsioBrokerServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *param_3)

{
  string_view message;
  string_view message_00;
  undefined1 *in_RSI;
  char *in_RDI;
  lock_guard<std::mutex> tlock;
  mutex_type *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  type *in_stack_ffffffffffffffb8;
  thread *in_stack_ffffffffffffffc0;
  
  if ((lock_guard<std::mutex> *)in_RSI == (lock_guard<std::mutex> *)0x0) {
    in_RSI = null_abi_cxx11_;
  }
  *(undefined1 **)(in_RDI + 0x88) = in_RSI;
  if ((in_RDI[0xb0] & 1U) != 0) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_RDI);
    message._M_str = in_RSI;
    message._M_len = (size_t)in_stack_ffffffffffffff88;
    TypedBrokerServer::logMessage(message);
  }
  if ((in_RDI[0xb1] & 1U) != 0) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_RDI);
    message_00._M_str = in_RSI;
    message_00._M_len = (size_t)in_stack_ffffffffffffff88;
    TypedBrokerServer::logMessage(message_00);
  }
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RSI,in_stack_ffffffffffffff88);
  std::thread::
  thread<helics::apps::AsioBrokerServer::startServer(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const*,std::shared_ptr<helics::apps::TypedBrokerServer>const&)::__0,,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  CLI::std::thread::operator=((thread *)in_RSI,(thread *)in_stack_ffffffffffffff88);
  CLI::std::thread::~thread((thread *)0x202db2);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x202dbc);
  return;
}

Assistant:

void AsioBrokerServer::startServer(const nlohmann::json* val,
                                       const std::shared_ptr<TypedBrokerServer>& /*ptr*/)
    {
        config_ = (val != nullptr) ? val : &null;

        if (tcp_enabled_) {
            logMessage("starting tcp broker server");
        }
        if (udp_enabled_) {
            logMessage("starting udp broker server");
        }
        std::lock_guard<std::mutex> tlock(threadGuard);
        mainLoopThread = std::thread([this]() { mainLoop(); });
    }